

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O2

int QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(unsigned_long *i)

{
  ulong i_00;
  
  i_00 = *i;
  if ((i_00 & 0xffffffff80000000) != 0) {
    error(i_00);
    i_00 = *i;
  }
  return (int)i_00;
}

Assistant:

inline static To
        convert(From const& i)
        {
            // From is unsigned, and to is signed. Convert To's max to the
            // unsigned version of To and compare i against that.
            auto maxval = static_cast<typename to_u<To>::type>(std::numeric_limits<To>::max());
            if (i > maxval) {
                error(i);
            }
            return static_cast<To>(i);
        }